

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O3

void Ptex::v2_2::(anonymous_namespace)::ApplyS<Ptex::v2_2::PtexHalf,4>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int nTxChan)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ushort *puVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  iVar11 = k->v1;
  iVar6 = k->v2;
  if (iVar11 != iVar6) {
    fVar1 = k->A;
    iVar7 = -iVar11;
    do {
      iVar4 = k->rowlen;
      iVar5 = k->u1;
      iVar10 = (iVar4 - iVar11) - k->w2;
      if (iVar10 < iVar5) {
        iVar10 = iVar5;
      }
      iVar9 = (iVar4 - iVar11) - k->w1;
      if (k->u2 < iVar9) {
        iVar9 = k->u2;
      }
      iVar9 = (iVar9 - iVar10) * nTxChan;
      if (0 < iVar9) {
        fVar14 = (float)iVar10 - k->u;
        fVar13 = (float)iVar11 - k->v;
        fVar15 = fVar14 * k->A * fVar14 + (k->B * fVar14 + k->C * fVar13) * fVar13;
        fVar13 = (fVar14 + fVar14 + 1.0) * k->A + fVar13 * k->B;
        iVar6 = (iVar4 + iVar7) - k->w2;
        if (iVar6 < iVar5) {
          iVar6 = iVar5;
        }
        puVar8 = (ushort *)((long)data + (long)((iVar6 + iVar4 * iVar11) * nTxChan) * 2);
        do {
          if (fVar15 < 1.0) {
            fVar12 = expf(fVar15 * -6.125);
            fVar12 = fVar12 * k->wscale;
            k->weight = k->weight + fVar12;
            fVar14 = *(float *)(PtexHalf::h2fTable + (ulong)puVar8[3] * 4);
            fVar2 = *(float *)(PtexHalf::h2fTable + (ulong)puVar8[2] * 4);
            fVar3 = *(float *)(PtexHalf::h2fTable + (ulong)puVar8[1] * 4);
            *result = fVar12 * *(float *)(PtexHalf::h2fTable + (ulong)*puVar8 * 4) + *result;
            result[1] = fVar12 * fVar3 + result[1];
            result[2] = fVar12 * fVar2 + result[2];
            result[3] = fVar12 * fVar14 + result[3];
          }
          fVar15 = fVar15 + fVar13;
          fVar13 = fVar13 + fVar1 + fVar1;
          puVar8 = puVar8 + nTxChan;
        } while (puVar8 < (ushort *)
                          ((long)data +
                          (long)iVar9 * 2 + (long)((iVar10 + iVar4 * iVar11) * nTxChan) * 2));
        iVar6 = k->v2;
      }
      iVar11 = iVar11 + 1;
      iVar7 = iVar7 + -1;
    } while (iVar11 != iVar6);
  }
  return;
}

Assistant:

void ApplyS(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int nTxChan)
    {
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }